

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

uint32 Js::ES5Array::ToLengthValue(Var value,ScriptContext *scriptContext)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  uint32 uVar3;
  double dVar4;
  
  bVar2 = TaggedInt::Is(value);
  if (bVar2) {
    uVar3 = TaggedInt::ToInt32(value);
    if (-1 < (int)uVar3) {
      return uVar3;
    }
  }
  else {
    uVar3 = JavascriptConversion::ToUInt32(value,scriptContext);
    dVar4 = JavascriptConversion::ToNumber(value,scriptContext);
    if ((dVar4 == (double)uVar3) && (!NAN(dVar4) && !NAN((double)uVar3))) {
      pIVar1 = &scriptContext->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
      return uVar3;
    }
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
}

Assistant:

uint32 ES5Array::ToLengthValue(Var value, ScriptContext* scriptContext)
    {
        if (TaggedInt::Is(value))
        {
            int32 newLen = TaggedInt::ToInt32(value);
            if (newLen < 0)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }
            return static_cast<uint32>(newLen);
        }
        else
        {
            uint32 newLen = JavascriptConversion::ToUInt32(value, scriptContext);
            if (newLen != JavascriptConversion::ToNumber(value, scriptContext))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }

            // Conversion can change the type (e.g. from String), invalidating assumptions made by the JIT
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);

            return newLen;
        }
    }